

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  size_t sVar1;
  long in_FS_OFFSET;
  wchar_t *local_50;
  size_t local_48;
  wchar_t local_40 [4];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (wchar_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
      return;
    }
  }
  else {
    local_50 = local_40;
    sVar1 = wcslen(str);
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_50,str,str + sVar1);
    PrintCharsAsStringTo<wchar_t>(local_50,local_48,os);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
                if (str == NULL) {
                    *os << "NULL";
                }
                else {
                    UniversalPrint(::std::wstring(str), os);
                }
            }